

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O2

void set_look_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  Am_Value my_look;
  Am_Widget_Look local_1c;
  Am_Value local_18;
  
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)cmd,0x17f);
  Am_Value::Am_Value(&local_18,pAVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"Setting look to ");
  poVar2 = (ostream *)operator<<(poVar2,&local_18);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ostream::flush();
  Am_Widget_Look::Am_Widget_Look(&local_1c,&local_18);
  Am_Set_Default_Look((Am_Widget_Look *)(ulong)local_1c.value);
  Am_Value::~Am_Value(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, set_look, (Am_Object cmd))
{
  Am_Value my_look = cmd.Get(Am_WIDGET_LOOK);
  std::cout << "Setting look to " << my_look << std::endl << std::flush;
  Am_Set_Default_Look(my_look);
}